

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpargrid.cpp
# Opt level: O2

short __thiscall TPZGenPartialGrid::Read(TPZGenPartialGrid *this,TPZGeoMesh *grid)

{
  int i;
  TPZGeoNode *this_00;
  int *piVar1;
  int iVar2;
  int iVar3;
  int64_t index;
  TPZVec<long> nos;
  TPZVec<double> coor;
  
  nos._vptr_TPZVec = (_func_int **)0x0;
  TPZVec<double>::TPZVec(&coor,2,(double *)&nos);
  if ((grid->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements < this->fNumNodes) {
    TPZAdmChunkVector<TPZGeoNode,_10>::Resize(&grid->fNodeVec,(int)this->fNumNodes);
  }
  piVar1 = (this->fRangex).fStore;
  for (iVar2 = *piVar1; iVar2 <= piVar1[1]; iVar2 = iVar2 + 1) {
    piVar1 = (this->fRangey).fStore;
    for (iVar3 = *piVar1; iVar3 <= piVar1[1]; iVar3 = iVar3 + 1) {
      i = (*(this->fNx).fStore + 1) * iVar3 + iVar2;
      Coord(this,i,&coor);
      this_00 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                          (&(grid->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)i);
      TPZGeoNode::Initialize(this_00,&coor,grid);
      piVar1 = (this->fRangey).fStore;
    }
    piVar1 = (this->fRangex).fStore;
  }
  TPZVec<long>::TPZVec(&nos,4);
  piVar1 = (this->fRangex).fStore;
  for (iVar2 = *piVar1; iVar2 < piVar1[1]; iVar2 = iVar2 + 1) {
    piVar1 = (this->fRangey).fStore;
    for (iVar3 = *piVar1; iVar3 < piVar1[1]; iVar3 = iVar3 + 1) {
      ElementConnectivity(this,(long)(*(this->fNx).fStore * iVar3 + iVar2),&nos);
      if (this->fElementType == 0) {
        (*(grid->super_TPZSavable)._vptr_TPZSavable[0xc])(grid,3,&nos,1,&index,1);
      }
      else {
        (*(grid->super_TPZSavable)._vptr_TPZSavable[0xc])(grid,2,&nos,1,&index,1);
        *(int *)(nos.fStore + 1) = (int)nos.fStore[2];
        *(undefined4 *)((long)nos.fStore + 0xc) = *(undefined4 *)((long)nos.fStore + 0x14);
        *(int *)(nos.fStore + 2) = (int)nos.fStore[3];
        *(undefined4 *)((long)nos.fStore + 0x14) = *(undefined4 *)((long)nos.fStore + 0x1c);
        (*(grid->super_TPZSavable)._vptr_TPZSavable[0xc])(grid,2,&nos,1,&index,1);
      }
      piVar1 = (this->fRangey).fStore;
    }
    piVar1 = (this->fRangex).fStore;
  }
  TPZGeoMesh::BuildConnectivity(grid);
  TPZVec<long>::~TPZVec(&nos);
  TPZVec<double>::~TPZVec(&coor);
  return 0;
}

Assistant:

short
TPZGenPartialGrid::Read (TPZGeoMesh &grid) {
	
	TPZVec<REAL> coor(2,0.);
	int i,j;
	int64_t index;
	
	if(grid.NodeVec().NElements() < fNumNodes) grid.NodeVec().Resize(fNumNodes);
	for(i=fRangex[0]; i<fRangex[1]+1; i++) {
		for(j = fRangey[0]; j<fRangey[1]+1; j++) {
			index = NodeIndex(i,j);
			Coord(index,coor);
			grid.NodeVec()[index].Initialize(coor,grid);
		}
	}
	//
	//numbering the nodes
	//
	// create the geometric elements (retangular)
	
	TPZVec<int64_t> nos(4);
	for(i=fRangex[0]; i<fRangex[1]; i++) {
		for(j=fRangey[0]; j<fRangey[1]; j++) {
			index = ElementIndex(i,j);
			ElementConnectivity(index,nos);
			if(fElementType == 0) {
				int64_t index;   
				grid.CreateGeoElement(EQuadrilateral,nos,1,index);
			} else {
				int64_t index;   
				grid.CreateGeoElement(ETriangle,nos,1,index);
				nos[1] = nos[2];
				nos[2] = nos[3];
				grid.CreateGeoElement(ETriangle,nos,1,index);
			}
		}
	}
	grid.BuildConnectivity();
	return 0;
	
}